

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_scan_sse41_128_32.c
# Opt level: O3

parasail_result_t *
parasail_sg_flags_rowcol_scan_profile_sse41_128_32
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap,int s1_beg,int s1_end,
          int s2_beg,int s2_end)

{
  ulong uVar1;
  int *piVar2;
  uint *puVar3;
  undefined4 *puVar4;
  uint uVar5;
  void *pvVar6;
  parasail_matrix_t *ppVar7;
  int *piVar8;
  bool bVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  uint uVar13;
  int iVar14;
  uint uVar15;
  parasail_result_t *ppVar16;
  __m128i *ptr;
  int32_t *ptr_00;
  __m128i *ptr_01;
  __m128i *ptr_02;
  __m128i *ptr_03;
  int iVar17;
  uint uVar18;
  int iVar19;
  int32_t iVar20;
  long lVar21;
  __m128i *palVar22;
  int iVar23;
  int iVar24;
  uint uVar25;
  ulong size;
  ulong uVar26;
  __m128i *palVar27;
  ulong uVar28;
  uint uVar29;
  int32_t iVar30;
  uint uVar31;
  uint uVar36;
  uint uVar37;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  uint uVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  uint uVar41;
  uint uVar44;
  uint uVar45;
  undefined1 auVar42 [16];
  uint uVar46;
  undefined1 auVar43 [16];
  ulong uVar47;
  undefined1 auVar48 [16];
  int iVar52;
  int iVar53;
  undefined1 auVar49 [16];
  int iVar54;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar55 [16];
  int iVar56;
  uint uVar60;
  uint uVar62;
  undefined1 auVar57 [16];
  int iVar61;
  int iVar63;
  uint uVar64;
  int iVar65;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  int iVar67;
  int iVar71;
  int iVar72;
  undefined1 in_XMM11 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  int iVar73;
  __m128i alVar70;
  int iVar74;
  undefined1 auVar75 [16];
  int iVar76;
  int iVar77;
  int iVar79;
  int iVar80;
  __m128i alVar78;
  int iVar81;
  undefined1 in_XMM14 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 in_XMM15 [16];
  undefined1 auVar84 [16];
  uint local_b0;
  int iVar66;
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_sg_flags_rowcol_scan_profile_sse41_128_32_cold_8();
  }
  else {
    pvVar6 = (profile->profile32).score;
    if (pvVar6 == (void *)0x0) {
      parasail_sg_flags_rowcol_scan_profile_sse41_128_32_cold_7();
    }
    else {
      ppVar7 = profile->matrix;
      if (ppVar7 == (parasail_matrix_t *)0x0) {
        parasail_sg_flags_rowcol_scan_profile_sse41_128_32_cold_6();
      }
      else {
        uVar5 = profile->s1Len;
        if ((int)uVar5 < 1) {
          parasail_sg_flags_rowcol_scan_profile_sse41_128_32_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_sg_flags_rowcol_scan_profile_sse41_128_32_cold_4();
        }
        else if (s2Len < 1) {
          parasail_sg_flags_rowcol_scan_profile_sse41_128_32_cold_3();
        }
        else if (open < 0) {
          parasail_sg_flags_rowcol_scan_profile_sse41_128_32_cold_2();
        }
        else if (gap < 0) {
          parasail_sg_flags_rowcol_scan_profile_sse41_128_32_cold_1();
        }
        else {
          uVar13 = uVar5 - 1;
          uVar28 = (ulong)uVar5 + 3;
          size = uVar28 >> 2;
          uVar47 = (ulong)uVar13 % size;
          iVar14 = (int)(uVar13 / size);
          iVar24 = -open;
          iVar17 = ppVar7->min;
          uVar18 = 0x80000000 - iVar17;
          if (iVar17 != iVar24 && SBORROW4(iVar17,iVar24) == iVar17 + open < 0) {
            uVar18 = open | 0x80000000;
          }
          uVar15 = 0x7ffffffe - ppVar7->max;
          ppVar16 = parasail_result_new_rowcol1((uint)uVar28 & 0x7ffffffc,s2Len);
          if (ppVar16 != (parasail_result_t *)0x0) {
            ppVar16->flag =
                 (uint)(s1_end != 0) * 0x10 + (uint)(s1_beg != 0) * 8 | (uint)(s2_beg != 0) << 0xe |
                 (uint)(s2_end != 0) << 0xf | ppVar16->flag | 0x4440402;
            ptr = parasail_memalign___m128i(0x10,size);
            ptr_00 = parasail_memalign_int32_t(0x10,(ulong)(s2Len + 1));
            ptr_01 = parasail_memalign___m128i(0x10,size);
            ptr_02 = parasail_memalign___m128i(0x10,size);
            ptr_03 = parasail_memalign___m128i(0x10,size);
            if (ptr_03 != (__m128i *)0x0 &&
                ((ptr_02 != (__m128i *)0x0 && ptr_01 != (__m128i *)0x0) &&
                (ptr_00 != (int32_t *)0x0 && ptr != (__m128i *)0x0))) {
              iVar17 = s2Len + -1;
              iVar23 = -iVar14 + 3;
              uVar18 = uVar18 + 1;
              auVar39._4_4_ = uVar18;
              auVar39._0_4_ = uVar18;
              auVar39._8_4_ = uVar18;
              auVar39._12_4_ = uVar18;
              auVar42._4_4_ = uVar15;
              auVar42._0_4_ = uVar15;
              auVar42._8_4_ = uVar15;
              auVar42._12_4_ = uVar15;
              uVar29 = (uint)size;
              iVar19 = -(uVar29 * gap);
              auVar49._4_4_ = iVar24;
              auVar49._0_4_ = iVar24;
              auVar49._8_4_ = iVar24;
              auVar49._12_4_ = iVar24;
              auVar55._0_8_ = CONCAT44(0,open);
              auVar55._8_4_ = open;
              auVar55._12_4_ = 0;
              auVar57._8_4_ = uVar29;
              auVar57._0_8_ = size;
              auVar57._12_4_ = 0;
              auVar68 = pmovsxbq(in_XMM11,0x302);
              auVar68 = pmuldq(auVar68,auVar57);
              auVar57 = pmuldq(auVar57,_DAT_00903a90);
              uVar26 = 0;
              auVar42 = pmovsxdq(auVar42,0x8000000080000000);
              palVar22 = ptr_02;
              palVar27 = ptr;
              do {
                if (s1_beg == 0) {
                  auVar84._8_4_ = (int)uVar26;
                  auVar84._0_8_ = uVar26;
                  auVar84._12_4_ = (int)(uVar26 >> 0x20);
                  auVar32._0_4_ = (undefined4)(uVar26 + auVar57._0_8_);
                  auVar32._4_4_ = (int)(auVar84._8_8_ + auVar57._8_8_);
                  auVar32._8_4_ = (int)(auVar68._0_8_ + uVar26);
                  auVar32._12_4_ = (int)(auVar68._8_8_ + auVar84._8_8_);
                  auVar82._4_4_ = gap;
                  auVar82._0_4_ = gap;
                  auVar82._8_4_ = gap;
                  auVar82._12_4_ = gap;
                  auVar82 = pmulld(auVar32,auVar82);
                  alVar78[0]._0_4_ = iVar24 - auVar82._0_4_;
                  alVar78[0]._4_4_ = iVar24 - auVar82._4_4_;
                  alVar78[1]._0_4_ = iVar24 - auVar82._8_4_;
                  alVar78[1]._4_4_ = iVar24 - auVar82._12_4_;
                }
                else {
                  alVar78[0] = 0;
                  alVar78[1] = 0;
                }
                auVar82 = pmovsxdq(in_XMM14,(undefined1  [16])alVar78);
                auVar33._0_8_ = alVar78[1];
                auVar33._8_4_ = (int)alVar78[1];
                auVar33._12_4_ = alVar78[1]._4_4_;
                auVar84 = pmovsxdq(in_XMM15,auVar33);
                in_XMM15._0_8_ = auVar84._0_8_ - auVar55._0_8_;
                in_XMM15._8_8_ = auVar84._8_8_ - (ulong)(uint)open;
                auVar83._0_8_ = auVar82._0_8_ - auVar55._0_8_;
                auVar83._8_8_ = auVar82._8_8_ - (ulong)(uint)open;
                auVar34._0_8_ = -(ulong)(auVar42._0_8_ < auVar83._0_8_);
                auVar34._8_8_ = -(ulong)(auVar42._8_8_ < auVar83._8_8_);
                auVar82 = blendvpd(auVar42,auVar83,auVar34);
                auVar35._0_8_ = -(ulong)(auVar42._0_8_ < in_XMM15._0_8_);
                auVar35._8_8_ = -(ulong)(auVar42._8_8_ < in_XMM15._8_8_);
                in_XMM14 = blendvpd(auVar42,in_XMM15,auVar35);
                *palVar22 = alVar78;
                *(int *)*palVar27 = auVar82._0_4_;
                *(int *)((long)*palVar27 + 4) = auVar82._8_4_;
                *(int *)(*palVar27 + 1) = in_XMM14._0_4_;
                *(int *)((long)*palVar27 + 0xc) = in_XMM14._8_4_;
                uVar26 = uVar26 + 1;
                palVar27 = palVar27 + 1;
                palVar22 = palVar22 + 1;
              } while (size != uVar26);
              *ptr_00 = 0;
              auVar42 = _DAT_00906ca0;
              lVar21 = (ulong)(uint)s2Len - 1;
              auVar68._8_4_ = (int)lVar21;
              auVar68._0_8_ = lVar21;
              auVar68._12_4_ = (int)((ulong)lVar21 >> 0x20);
              iVar30 = 0;
              auVar49 = pmovsxbq(auVar49,0x302);
              auVar55 = pmovsxbq(auVar55,0x100);
              auVar68 = auVar68 ^ _DAT_00906ca0;
              uVar26 = 0;
              do {
                uVar1 = auVar42._0_8_;
                lVar21 = auVar68._0_8_;
                if ((bool)(~(lVar21 < (long)(uVar26 ^ uVar1)) & 1)) {
                  iVar20 = 0;
                  if (s2_beg == 0) {
                    iVar20 = iVar24;
                  }
                  ptr_00[uVar26 + 1] = iVar20;
                }
                auVar75._8_4_ = (int)uVar26;
                auVar75._0_8_ = uVar26;
                auVar75._12_4_ = (int)(uVar26 >> 0x20);
                if ((long)((auVar75._8_8_ | auVar55._8_8_) ^ auVar42._8_8_) <= auVar68._8_8_) {
                  iVar52 = iVar24 - gap;
                  if (s2_beg != 0) {
                    iVar52 = iVar30;
                  }
                  ptr_00[uVar26 + 2] = iVar52;
                }
                bVar9 = (long)((uVar26 | auVar49._0_8_) ^ uVar1) <= lVar21;
                if (bVar9) {
                  iVar52 = gap * -2 + iVar24;
                  if (s2_beg != 0) {
                    iVar52 = iVar30;
                  }
                  ptr_00[uVar26 + 3] = iVar52;
                }
                if (bVar9) {
                  iVar52 = gap * -3 + iVar24;
                  if (s2_beg != 0) {
                    iVar52 = iVar30;
                  }
                  ptr_00[uVar26 + 4] = iVar52;
                }
                uVar26 = uVar26 + 4;
                iVar24 = iVar24 + gap * -4;
              } while ((s2Len + 3U & 0xfffffffc) != uVar26);
              iVar24 = -open;
              iVar52 = -open;
              iVar53 = -open;
              iVar54 = -open;
              palVar22 = ptr_03 + (uVar29 - 1);
              uVar26 = size;
              uVar31 = uVar15;
              uVar36 = uVar15;
              uVar37 = uVar15;
              uVar38 = uVar15;
              do {
                *(int *)*palVar22 = iVar24;
                *(int *)((long)*palVar22 + 4) = iVar52;
                *(int *)(*palVar22 + 1) = iVar53;
                *(int *)((long)*palVar22 + 0xc) = iVar54;
                iVar24 = iVar24 - gap;
                iVar52 = iVar52 - gap;
                iVar53 = iVar53 - gap;
                iVar54 = iVar54 - gap;
                uVar31 = (uint)(iVar24 < (int)uVar31) * iVar24 | (iVar24 >= (int)uVar31) * uVar31;
                uVar36 = (uint)(iVar52 < (int)uVar36) * iVar52 | (iVar52 >= (int)uVar36) * uVar36;
                uVar37 = (uint)(iVar53 < (int)uVar37) * iVar53 | (iVar53 >= (int)uVar37) * uVar37;
                uVar38 = (uint)(iVar54 < (int)uVar38) * iVar54 | (iVar54 >= (int)uVar38) * uVar38;
                palVar22 = palVar22 + -1;
                iVar76 = (int)uVar26;
                uVar25 = iVar76 - 1;
                uVar26 = (ulong)uVar25;
              } while (uVar25 != 0 && 0 < iVar76);
              palVar22 = ptr_02 + (uVar29 - 1);
              auVar48._0_4_ = -(uint)(iVar23 == 3);
              auVar48._4_4_ = -(uint)(iVar23 == 2);
              auVar48._8_4_ = -(uint)(iVar23 == 1);
              auVar48._12_4_ = -(uint)(-iVar14 == -3);
              uVar26 = 0;
              auVar50 = auVar39;
              auVar58 = auVar39;
              iVar24 = iVar17;
              do {
                iVar52 = ppVar7->mapper[(byte)s2[uVar26]];
                uVar25 = uVar18 - (int)(*ptr_03)[0];
                uVar60 = uVar18 - *(int *)((long)*ptr_03 + 4);
                uVar62 = uVar18 - (int)(*ptr_03)[1];
                uVar64 = uVar18 - *(int *)((long)*ptr_03 + 0xc);
                lVar21 = 0;
                auVar42 = auVar39;
                iVar30 = ptr_00[uVar26];
                iVar53 = (int)(*palVar22)[0];
                iVar54 = *(int *)((long)*palVar22 + 4);
                iVar76 = (int)(*palVar22)[1];
                do {
                  piVar8 = (int *)((long)*ptr_02 + lVar21);
                  iVar67 = *piVar8;
                  iVar71 = piVar8[1];
                  iVar72 = piVar8[2];
                  iVar73 = piVar8[3];
                  piVar8 = (int *)((long)*ptr + lVar21);
                  piVar2 = (int *)((long)pvVar6 + lVar21 + (long)iVar52 * size * 0x10);
                  iVar74 = iVar30 + *piVar2;
                  iVar53 = iVar53 + piVar2[1];
                  iVar54 = iVar54 + piVar2[2];
                  iVar76 = iVar76 + piVar2[3];
                  piVar2 = (int *)((long)*ptr_03 + lVar21);
                  iVar56 = uVar25 + *piVar2;
                  iVar61 = uVar60 + piVar2[1];
                  iVar63 = uVar62 + piVar2[2];
                  iVar65 = uVar64 + piVar2[3];
                  iVar77 = *piVar8 - gap;
                  iVar79 = piVar8[1] - gap;
                  iVar80 = piVar8[2] - gap;
                  iVar81 = piVar8[3] - gap;
                  iVar66 = auVar42._0_4_;
                  auVar69._0_4_ =
                       (uint)(iVar66 < iVar56) * iVar56 | (uint)(iVar66 >= iVar56) * iVar66;
                  iVar56 = auVar42._4_4_;
                  auVar69._4_4_ =
                       (uint)(iVar56 < iVar61) * iVar61 | (uint)(iVar56 >= iVar61) * iVar56;
                  iVar56 = auVar42._8_4_;
                  iVar61 = auVar42._12_4_;
                  auVar69._8_4_ =
                       (uint)(iVar56 < iVar63) * iVar63 | (uint)(iVar56 >= iVar63) * iVar56;
                  auVar69._12_4_ =
                       (uint)(iVar61 < iVar65) * iVar65 | (uint)(iVar61 >= iVar65) * iVar61;
                  iVar56 = iVar67 - open;
                  iVar61 = iVar71 - open;
                  iVar63 = iVar72 - open;
                  iVar65 = iVar73 - open;
                  uVar41 = (uint)(iVar56 < iVar77) * iVar77 | (uint)(iVar56 >= iVar77) * iVar56;
                  uVar44 = (uint)(iVar61 < iVar79) * iVar79 | (uint)(iVar61 >= iVar79) * iVar61;
                  uVar45 = (uint)(iVar63 < iVar80) * iVar80 | (uint)(iVar63 >= iVar80) * iVar63;
                  uVar46 = (uint)(iVar65 < iVar81) * iVar81 | (uint)(iVar65 >= iVar81) * iVar65;
                  uVar25 = (iVar74 < (int)uVar41) * uVar41 | (uint)(iVar74 >= (int)uVar41) * iVar74;
                  uVar60 = (iVar53 < (int)uVar44) * uVar44 | (uint)(iVar53 >= (int)uVar44) * iVar53;
                  uVar62 = (iVar54 < (int)uVar45) * uVar45 | (uint)(iVar54 >= (int)uVar45) * iVar54;
                  uVar64 = (iVar76 < (int)uVar46) * uVar46 | (uint)(iVar76 >= (int)uVar46) * iVar76;
                  puVar3 = (uint *)((long)*ptr + lVar21);
                  *puVar3 = uVar41;
                  puVar3[1] = uVar44;
                  puVar3[2] = uVar45;
                  puVar3[3] = uVar46;
                  puVar3 = (uint *)((long)*ptr_01 + lVar21);
                  *puVar3 = uVar25;
                  puVar3[1] = uVar60;
                  puVar3[2] = uVar62;
                  puVar3[3] = uVar64;
                  lVar21 = lVar21 + 0x10;
                  auVar42 = auVar69;
                  iVar30 = iVar67;
                  iVar53 = iVar71;
                  iVar54 = iVar72;
                  iVar76 = iVar73;
                } while (size << 4 != lVar21);
                iVar52 = ptr_00[uVar26 + 1];
                uVar1 = uVar26 + 1;
                iVar53 = (int)(*ptr_03)[0] + iVar52;
                iVar54 = *(int *)((long)*ptr_03 + 4) + uVar25;
                iVar76 = (int)(*ptr_03)[1] + uVar60;
                uVar64 = (uint)((int)auVar69._0_4_ < iVar53) * iVar53 |
                         ((int)auVar69._0_4_ >= iVar53) * auVar69._0_4_;
                uVar41 = (uint)((int)auVar69._4_4_ < iVar54) * iVar54 |
                         ((int)auVar69._4_4_ >= iVar54) * auVar69._4_4_;
                uVar44 = (uint)((int)auVar69._8_4_ < iVar76) * iVar76 |
                         ((int)auVar69._8_4_ >= iVar76) * auVar69._8_4_;
                iVar53 = uVar64 + iVar19;
                iVar54 = uVar41 + iVar19;
                uVar64 = ((int)uVar18 < (int)uVar64) * uVar64 |
                         ((int)uVar18 >= (int)uVar64) * uVar18;
                uVar41 = (iVar53 < (int)uVar41) * uVar41 | (uint)(iVar53 >= (int)uVar41) * iVar53;
                uVar44 = (iVar54 < (int)uVar44) * uVar44 | (uint)(iVar54 >= (int)uVar44) * iVar54;
                iVar53 = uVar64 + iVar19;
                iVar54 = uVar41 + iVar19;
                uVar45 = ((int)uVar18 < (int)uVar64) * uVar64 |
                         ((int)uVar18 >= (int)uVar64) * uVar18;
                uVar46 = (iVar53 < (int)uVar41) * uVar41 | (uint)(iVar53 >= (int)uVar41) * iVar53;
                uVar44 = (iVar54 < (int)uVar44) * uVar44 | (uint)(iVar54 >= (int)uVar44) * iVar54;
                uVar64 = (iVar52 < (int)uVar18) * uVar18 | (uint)(iVar52 >= (int)uVar18) * iVar52;
                uVar41 = ((int)uVar25 < (int)uVar45) * uVar45 |
                         ((int)uVar25 >= (int)uVar45) * uVar25;
                uVar60 = ((int)uVar60 < (int)uVar46) * uVar46 |
                         ((int)uVar60 >= (int)uVar46) * uVar60;
                uVar62 = ((int)uVar62 < (int)uVar44) * uVar44 |
                         ((int)uVar62 >= (int)uVar44) * uVar62;
                lVar21 = 0;
                auVar42 = auVar50;
                uVar25 = uVar18;
                do {
                  iVar67 = uVar25 - gap;
                  iVar71 = uVar45 - gap;
                  iVar72 = uVar46 - gap;
                  iVar73 = uVar44 - gap;
                  iVar52 = uVar64 - open;
                  iVar53 = uVar41 - open;
                  iVar54 = uVar60 - open;
                  iVar76 = uVar62 - open;
                  uVar25 = (uint)(iVar67 < iVar52) * iVar52 | (uint)(iVar67 >= iVar52) * iVar67;
                  uVar45 = (uint)(iVar71 < iVar53) * iVar53 | (uint)(iVar71 >= iVar53) * iVar71;
                  uVar46 = (uint)(iVar72 < iVar54) * iVar54 | (uint)(iVar72 >= iVar54) * iVar72;
                  uVar44 = (uint)(iVar73 < iVar76) * iVar76 | (uint)(iVar73 >= iVar76) * iVar73;
                  piVar8 = (int *)((long)*ptr_01 + lVar21);
                  iVar52 = *piVar8;
                  iVar53 = piVar8[1];
                  iVar54 = piVar8[2];
                  iVar76 = piVar8[3];
                  uVar64 = (iVar52 < (int)uVar25) * uVar25 | (uint)(iVar52 >= (int)uVar25) * iVar52;
                  uVar41 = (iVar53 < (int)uVar45) * uVar45 | (uint)(iVar53 >= (int)uVar45) * iVar53;
                  uVar60 = (iVar54 < (int)uVar46) * uVar46 | (uint)(iVar54 >= (int)uVar46) * iVar54;
                  uVar62 = (iVar76 < (int)uVar44) * uVar44 | (uint)(iVar76 >= (int)uVar44) * iVar76;
                  puVar3 = (uint *)((long)*ptr_02 + lVar21);
                  *puVar3 = uVar64;
                  puVar3[1] = uVar41;
                  puVar3[2] = uVar60;
                  puVar3[3] = uVar62;
                  uVar31 = ((int)uVar25 < (int)uVar31) * uVar25 |
                           ((int)uVar25 >= (int)uVar31) * uVar31;
                  uVar36 = ((int)uVar45 < (int)uVar36) * uVar45 |
                           ((int)uVar45 >= (int)uVar36) * uVar36;
                  uVar37 = ((int)uVar46 < (int)uVar37) * uVar46 |
                           ((int)uVar46 >= (int)uVar37) * uVar37;
                  uVar38 = ((int)uVar44 < (int)uVar38) * uVar44 |
                           ((int)uVar44 >= (int)uVar38) * uVar38;
                  uVar31 = ((int)uVar64 < (int)uVar31) * uVar64 |
                           ((int)uVar64 >= (int)uVar31) * uVar31;
                  uVar36 = ((int)uVar41 < (int)uVar36) * uVar41 |
                           ((int)uVar41 >= (int)uVar36) * uVar36;
                  uVar37 = ((int)uVar60 < (int)uVar37) * uVar60 |
                           ((int)uVar60 >= (int)uVar37) * uVar37;
                  uVar38 = ((int)uVar62 < (int)uVar38) * uVar62 |
                           ((int)uVar62 >= (int)uVar38) * uVar38;
                  iVar52 = auVar42._0_4_;
                  auVar50._0_4_ =
                       (iVar52 < (int)uVar64) * uVar64 | (uint)(iVar52 >= (int)uVar64) * iVar52;
                  iVar52 = auVar42._4_4_;
                  auVar50._4_4_ =
                       (iVar52 < (int)uVar41) * uVar41 | (uint)(iVar52 >= (int)uVar41) * iVar52;
                  iVar52 = auVar42._8_4_;
                  iVar53 = auVar42._12_4_;
                  auVar50._8_4_ =
                       (iVar52 < (int)uVar60) * uVar60 | (uint)(iVar52 >= (int)uVar60) * iVar52;
                  auVar50._12_4_ =
                       (iVar53 < (int)uVar62) * uVar62 | (uint)(iVar53 >= (int)uVar62) * iVar53;
                  lVar21 = lVar21 + 0x10;
                  auVar42 = auVar50;
                } while (size << 4 != lVar21);
                alVar70 = ptr_02[uVar47];
                iVar53 = (int)alVar70[0];
                iVar71 = auVar58._0_4_;
                auVar43._0_4_ = -(uint)(iVar71 < iVar53);
                iVar54 = alVar70[0]._4_4_;
                iVar72 = auVar58._4_4_;
                auVar43._4_4_ = -(uint)(iVar72 < iVar54);
                iVar76 = (int)alVar70[1];
                iVar73 = auVar58._8_4_;
                iVar67 = alVar70[1]._4_4_;
                auVar43._8_4_ = -(uint)(iVar73 < iVar76);
                iVar56 = auVar58._12_4_;
                auVar43._12_4_ = -(uint)(iVar56 < iVar67);
                iVar52 = movmskps((int)lVar21,auVar43 & auVar48);
                if (iVar52 != 0) {
                  iVar24 = (int)uVar26;
                }
                if (iVar14 < 3) {
                  iVar52 = 0;
                  do {
                    lVar21 = alVar70[1];
                    alVar70[1] = alVar70[0];
                    alVar70[0] = alVar70[1] << 0x20;
                    alVar70[1] = lVar21 << 0x20 | alVar70[1] >> 0x20;
                    iVar52 = iVar52 + 1;
                  } while (iVar52 < iVar23);
                }
                ((ppVar16->field_4).rowcols)->score_row[uVar26] = (int)(alVar70[1] >> 0x20);
                auVar58._0_4_ = (uint)(iVar53 < iVar71) * iVar71 | (uint)(iVar53 >= iVar71) * iVar53
                ;
                auVar58._4_4_ = (uint)(iVar54 < iVar72) * iVar72 | (uint)(iVar54 >= iVar72) * iVar54
                ;
                auVar58._8_4_ = (uint)(iVar76 < iVar73) * iVar73 | (uint)(iVar76 >= iVar73) * iVar76
                ;
                auVar58._12_4_ =
                     (uint)(iVar67 < iVar56) * iVar56 | (uint)(iVar67 >= iVar56) * iVar67;
                uVar26 = uVar1;
              } while (uVar1 != (uint)s2Len);
              lVar21 = 0;
              do {
                puVar4 = (undefined4 *)((long)*ptr_02 + lVar21 * 4);
                uVar10 = puVar4[1];
                uVar11 = puVar4[2];
                uVar12 = puVar4[3];
                piVar8 = ((ppVar16->field_4).rowcols)->score_col;
                *(undefined4 *)((long)piVar8 + lVar21) = *puVar4;
                *(undefined4 *)((long)piVar8 + size * 4 + lVar21) = uVar10;
                *(undefined4 *)((long)piVar8 + size * 8 + lVar21) = uVar11;
                *(undefined4 *)((long)piVar8 + size * 0xc + lVar21) = uVar12;
                lVar21 = lVar21 + 4;
              } while (size * 4 - lVar21 != 0);
              local_b0 = uVar18;
              if ((s2_end != 0) && (local_b0 = auVar58._12_4_, iVar14 < 3)) {
                iVar19 = 0;
                do {
                  auVar59._0_8_ = auVar58._0_8_ << 0x20;
                  auVar59._8_8_ = auVar58._8_8_ << 0x20 | auVar58._0_8_ >> 0x20;
                  local_b0 = auVar58._8_4_;
                  iVar19 = iVar19 + 1;
                  auVar58 = auVar59;
                } while (iVar19 < iVar23);
              }
              uVar25 = uVar13;
              if ((s1_end != 0) && ((uVar28 & 0x7ffffffc) != 0)) {
                uVar28 = 0;
                do {
                  uVar60 = ((uint)uVar28 & 3) * uVar29 + ((uint)(uVar28 >> 2) & 0x3fffffff);
                  iVar19 = iVar24;
                  uVar62 = uVar25;
                  uVar64 = local_b0;
                  if (((int)uVar60 < (int)uVar5) &&
                     (uVar41 = *(uint *)((long)*ptr_02 + uVar28 * 4), iVar19 = iVar17,
                     uVar62 = uVar60, uVar64 = uVar41, (int)uVar41 <= (int)local_b0)) {
                    if ((int)uVar25 <= (int)uVar60) {
                      uVar60 = uVar25;
                    }
                    iVar19 = iVar24;
                    uVar62 = uVar25;
                    uVar64 = local_b0;
                    if (iVar24 == iVar17 && uVar41 == local_b0) {
                      uVar62 = uVar60;
                    }
                  }
                  local_b0 = uVar64;
                  uVar25 = uVar62;
                  iVar24 = iVar19;
                  uVar28 = uVar28 + 1;
                } while ((uVar29 & 0x1fffffff) << 2 != (int)uVar28);
              }
              if (s2_end == 0 && s1_end == 0) {
                s1_end = (int)uVar47 * 0x10;
                uVar28 = ptr_02[uVar47][1];
                if (iVar14 < 3) {
                  s1_end = 0;
                  uVar47 = ptr_02[uVar47][0];
                  do {
                    uVar28 = uVar28 << 0x20 | uVar47 >> 0x20;
                    s1_end = s1_end + 1;
                    uVar47 = uVar47 << 0x20;
                  } while (s1_end < iVar23);
                }
                local_b0 = (uint)(uVar28 >> 0x20);
                iVar24 = iVar17;
                uVar25 = uVar13;
              }
              auVar40._0_4_ = -(uint)((int)uVar31 < (int)uVar18);
              auVar40._4_4_ = -(uint)((int)uVar36 < (int)uVar18);
              auVar40._8_4_ = -(uint)((int)uVar37 < (int)uVar18);
              auVar40._12_4_ = -(uint)((int)uVar38 < (int)uVar18);
              auVar51._0_4_ = -(uint)((int)uVar15 < (int)auVar50._0_4_);
              auVar51._4_4_ = -(uint)((int)uVar15 < (int)auVar50._4_4_);
              auVar51._8_4_ = -(uint)((int)uVar15 < (int)auVar50._8_4_);
              auVar51._12_4_ = -(uint)((int)uVar15 < (int)auVar50._12_4_);
              iVar17 = movmskps(s1_end,auVar51 | auVar40);
              if (iVar17 != 0) {
                *(byte *)&ppVar16->flag = (byte)ppVar16->flag | 0x40;
                local_b0 = 0;
                iVar24 = 0;
                uVar25 = 0;
              }
              ppVar16->score = local_b0;
              ppVar16->end_query = uVar25;
              ppVar16->end_ref = iVar24;
              parasail_free(ptr_03);
              parasail_free(ptr_02);
              parasail_free(ptr_01);
              parasail_free(ptr_00);
              parasail_free(ptr);
              return ppVar16;
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t s1Len = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict pvP = NULL;
    __m128i* restrict pvE = NULL;
    int32_t* restrict boundary = NULL;
    __m128i* restrict pvHt = NULL;
    __m128i* restrict pvH = NULL;
    __m128i* restrict pvGapper = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int32_t NEG_LIMIT = 0;
    int32_t POS_LIMIT = 0;
    __m128i vZero;
    int32_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vMaxH;
    __m128i vPosMask;
    __m128i vNegInfFront;
    __m128i vSegLenXgap;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile32.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 4; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    pvP = (__m128i*)profile->profile32.score;
    vGapO = _mm_set1_epi32(open);
    vGapE = _mm_set1_epi32(gap);
    NEG_LIMIT = (-open < matrix->min ? INT32_MIN + open : INT32_MIN - matrix->min) + 1;
    POS_LIMIT = INT32_MAX - matrix->max - 1;
    vZero = _mm_setzero_si128();
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi32(NEG_LIMIT);
    vPosLimit = _mm_set1_epi32(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vPosMask = _mm_cmpeq_epi32(_mm_set1_epi32(position),
            _mm_set_epi32(0,1,2,3));
    vNegInfFront = vZero;
    vNegInfFront = _mm_insert_epi32(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm_add_epi32(vNegInfFront,
            _mm_slli_si128(_mm_set1_epi32(-segLen*gap), 4));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_BITS_32 | PARASAIL_FLAG_LANES_4;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE = parasail_memalign___m128i(16, segLen);
    boundary = parasail_memalign_int32_t(16, s2Len+1);
    pvHt= parasail_memalign___m128i(16, segLen);
    pvH = parasail_memalign___m128i(16, segLen);
    pvGapper = parasail_memalign___m128i(16, segLen);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!boundary) return NULL;
    if (!pvHt) return NULL;
    if (!pvH) return NULL;
    if (!pvGapper) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_32_t h;
            __m128i_32_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = s1_beg ? 0 : (-open-gap*(segNum*segLen+i));
                h.v[segNum] = tmp < INT32_MIN ? INT32_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT32_MIN ? INT32_MIN : tmp;
            }
            _mm_store_si128(&pvH[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = s2_beg ? 0 : (-open-gap*(i-1));
            boundary[i] = tmp < INT32_MIN ? INT32_MIN : tmp;
        }
    }

    {
        __m128i vGapper = _mm_sub_epi32(vZero,vGapO);
        for (i=segLen-1; i>=0; --i) {
            _mm_store_si128(pvGapper+i, vGapper);
            vGapper = _mm_sub_epi32(vGapper, vGapE);
            /* long queries and/or large penalties will break the pseudo prefix scan */
            vSaturationCheckMin = _mm_min_epi32(vSaturationCheckMin, vGapper);
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        __m128i vHt;
        __m128i vF;
        __m128i vH;
        __m128i vHp;
        __m128i *pvW;
        __m128i vW;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm_load_si128(pvH+(segLen-1));
        vHp = _mm_slli_si128(vHp, 4);
        vHp = _mm_insert_epi32(vHp, boundary[j], 0);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = _mm_sub_epi32(vNegLimit, pvGapper[0]);
        vF = vNegLimit;
        for (i=0; i<segLen; ++i) {
            vH = _mm_load_si128(pvH+i);
            vE = _mm_load_si128(pvE+i);
            vW = _mm_load_si128(pvW+i);
            vE = _mm_max_epi32(
                    _mm_sub_epi32(vE, vGapE),
                    _mm_sub_epi32(vH, vGapO));
            vHp = _mm_add_epi32(vHp, vW);
            vF = _mm_max_epi32(vF, _mm_add_epi32(vHt, pvGapper[i]));
            vHt = _mm_max_epi32(vE, vHp);
            _mm_store_si128(pvE+i, vE);
            _mm_store_si128(pvHt+i, vHt);
            vHp = vH;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm_slli_si128(vHt, 4);
        vHt = _mm_insert_epi32(vHt, boundary[j+1], 0);
        vF = _mm_max_epi32(vF, _mm_add_epi32(vHt, pvGapper[0]));
        for (i=0; i<segWidth-2; ++i) {
            __m128i vFt = _mm_slli_si128(vF, 4);
            vFt = _mm_add_epi32(vFt, vSegLenXgap);
            vF = _mm_max_epi32(vF, vFt);
        }

        /* calculate final H */
        vF = _mm_slli_si128(vF, 4);
        vF = _mm_add_epi32(vF, vNegInfFront);
        vH = _mm_max_epi32(vHt, vF);
        for (i=0; i<segLen; ++i) {
            vHt = _mm_load_si128(pvHt+i);
            vF = _mm_max_epi32(
                    _mm_sub_epi32(vF, vGapE),
                    _mm_sub_epi32(vH, vGapO));
            vH = _mm_max_epi32(vHt, vF);
            _mm_store_si128(pvH+i, vH);
            vSaturationCheckMin = _mm_min_epi32(vSaturationCheckMin, vH);
            vSaturationCheckMin = _mm_min_epi32(vSaturationCheckMin, vF);
            vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
        } 

        /* extract vector containing last value from column */
        {
            __m128i vCompare;
            vH = _mm_load_si128(pvH + offset);
            vCompare = _mm_and_si128(vPosMask, _mm_cmpgt_epi32(vH, vMaxH));
            vMaxH = _mm_max_epi32(vH, vMaxH);
            if (_mm_movemask_epi8(vCompare)) {
                end_ref = j;
            }
#ifdef PARASAIL_ROWCOL
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 4);
            }
            result->rowcols->score_row[j] = (int32_t) _mm_extract_epi32 (vH, 3);
#endif
        }
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvH + i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* max last value from all columns */
    if (s2_end)
    {
        for (k=0; k<position; ++k) {
            vMaxH = _mm_slli_si128(vMaxH, 4);
        }
        score = (int32_t) _mm_extract_epi32(vMaxH, 3);
        end_query = s1Len-1;
    }

    /* max of last column */
    if (s1_end)
    {
        /* Trace the alignment ending position on read. */
        int32_t *t = (int32_t*)pvH;
        int32_t column_len = segLen * segWidth;
        for (i = 0; i<column_len; ++i, ++t) {
            int32_t temp = i / segWidth + i % segWidth * segLen;
            if (temp >= s1Len) continue;
            if (*t > score) {
                score = *t;
                end_query = temp;
                end_ref = s2Len-1;
            }
            else if (*t == score && end_ref == s2Len-1 && temp < end_query) {
                end_query = temp;
            }
        }
    }

    if (!s1_end && !s2_end) {
        /* extract last value from the last column */
        {
            __m128i vH = _mm_load_si128(pvH + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 4);
            }
            score = (int32_t) _mm_extract_epi32 (vH, 3);
            end_ref = s2Len - 1;
            end_query = s1Len - 1;
        }
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi32(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi32(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvGapper);
    parasail_free(pvH);
    parasail_free(pvHt);
    parasail_free(boundary);
    parasail_free(pvE);

    return result;
}